

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  uint uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  libssh2_socket_t sock;
  size_t in_stack_ffffffffffefffa0;
  ssize_t len;
  char buf [1048576];
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int rc;
  char *userauthlist;
  char *fingerprint;
  sockaddr_in sin;
  int auth;
  int i;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  channel = (LIBSSH2_CHANNEL *)0x0;
  buf[0xffff8] = '\0';
  buf[0xffff9] = '\0';
  buf[0xffffa] = '\0';
  buf[0xffffb] = '\0';
  buf[0xffffc] = '\0';
  buf[0xffffd] = '\0';
  buf[0xffffe] = '\0';
  buf[0xfffff] = '\0';
  if (1 < argc) {
    server_ip = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,6);
  if (__fd == -1) {
    fprintf(_stderr,"failed to open socket!\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._4_4_ = inet_addr(server_ip);
    if (fingerprint._4_4_ == 0xffffffff) {
      fprintf(_stderr,"inet_addr: Invalid IP address \"%s\"\n",server_ip);
    }
    else {
      fingerprint._2_2_ = htons(0x33e);
      iVar2 = connect(__fd,(sockaddr *)&fingerprint,0x10);
      __stream = _stderr;
      if (iVar2 == 0) {
        channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
        if (channel == (LIBSSH2_CHANNEL *)0x0) {
          fprintf(_stderr,"Could not initialize SSH session!\n");
        }
        else {
          uVar1 = libssh2_session_handshake(channel,__fd);
          if (uVar1 == 0) {
            lVar4 = libssh2_hostkey_hash(channel,2);
            fprintf(_stderr,"Fingerprint: ");
            sin.sin_zero[4] = '\0';
            sin.sin_zero[5] = '\0';
            sin.sin_zero[6] = '\0';
            sin.sin_zero[7] = '\0';
            for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
              fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar4 + (int)sin.sin_zero._4_4_));
            }
            fprintf(_stderr,"\n");
            pcVar3 = username;
            sVar5 = strlen(username);
            pcVar3 = (char *)libssh2_userauth_list(channel,pcVar3,sVar5 & 0xffffffff);
            if (pcVar3 != (char *)0x0) {
              fprintf(_stderr,"Authentication methods: %s\n",pcVar3);
              pcVar6 = strstr(pcVar3,"password");
              if (pcVar6 != (char *)0x0) {
                sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 1;
              }
              pcVar3 = strstr(pcVar3,"publickey");
              if (pcVar3 != (char *)0x0) {
                sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 2;
              }
              if (4 < argc) {
                if (((sin.sin_zero._0_4_ & 1) != 0) && (iVar2 = strcmp(argv[4],"-p"), iVar2 == 0)) {
                  sin.sin_zero[0] = '\x01';
                  sin.sin_zero[1] = '\0';
                  sin.sin_zero[2] = '\0';
                  sin.sin_zero[3] = '\0';
                }
                if (((sin.sin_zero._0_4_ & 2) != 0) && (iVar2 = strcmp(argv[4],"-k"), iVar2 == 0)) {
                  sin.sin_zero[0] = '\x02';
                  sin.sin_zero[1] = '\0';
                  sin.sin_zero[2] = '\0';
                  sin.sin_zero[3] = '\0';
                }
              }
              pcVar3 = username;
              if ((sin.sin_zero._0_4_ & 1) == 0) {
                if ((sin.sin_zero._0_4_ & 2) == 0) {
                  fprintf(_stderr,"No supported authentication methods found!\n");
                  goto LAB_00101a09;
                }
                sVar5 = strlen(username);
                iVar2 = libssh2_userauth_publickey_fromfile_ex
                                  (channel,pcVar3,sVar5 & 0xffffffff,pubkey,privkey,password);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by public key failed!\n");
                  goto LAB_00101a09;
                }
                fprintf(_stderr,"Authentication by public key succeeded.\n");
              }
              else {
                sVar5 = strlen(username);
                pcVar6 = password;
                sVar7 = strlen(password);
                iVar2 = libssh2_userauth_password_ex
                                  (channel,pcVar3,sVar5 & 0xffffffff,pcVar6,sVar7 & 0xffffffff,0);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by password failed!\n");
                  goto LAB_00101a09;
                }
              }
            }
            buf._1048568_8_ = libssh2_channel_open_ex(channel,"session",7,0x200000,0x8000,0);
            if ((LIBSSH2_CHANNEL *)buf._1048568_8_ == (LIBSSH2_CHANNEL *)0x0) {
              fprintf(_stderr,
                      "Could not open the channel!\n(Note that this can be a problem at the server! Please review the server logs.)\n"
                     );
            }
            else {
              iVar2 = libssh2_channel_process_startup(buf._1048568_8_,"subsystem",9,"netconf",7);
              if (iVar2 == 0) {
                fprintf(_stderr,"Sending NETCONF client <hello>\n");
                snprintf((char *)&len,0x100000,
                         "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<hello><capabilities><capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability></capabilities></hello>\n]]>]]>\n%n"
                         ,&stack0xffffffffffefffa0);
                iVar2 = netconf_write((LIBSSH2_CHANNEL *)buf._1048568_8_,(char *)&len,
                                      in_stack_ffffffffffefffa0);
                if (iVar2 != -1) {
                  fprintf(_stderr,"Reading NETCONF server <hello>\n");
                  uVar8 = netconf_read_until((LIBSSH2_CHANNEL *)buf._1048568_8_,"</hello>",
                                             (char *)&len,0x100000);
                  if (uVar8 != 0xffffffffffffffff) {
                    fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",uVar8 & 0xffffffff,
                            &len);
                    fprintf(_stderr,"Sending NETCONF <rpc>\n");
                    snprintf((char *)&len,0x100000,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\"><get-interface-information><terse/></get-interface-information></rpc>\n]]>]]>\n%n"
                             ,&stack0xffffffffffefffa0);
                    iVar2 = netconf_write((LIBSSH2_CHANNEL *)buf._1048568_8_,(char *)&len,uVar8);
                    if (iVar2 != -1) {
                      fprintf(_stderr,"Reading NETCONF <rpc-reply>\n");
                      uVar8 = netconf_read_until((LIBSSH2_CHANNEL *)buf._1048568_8_,"</rpc-reply>",
                                                 (char *)&len,0x100000);
                      if (uVar8 != 0xffffffffffffffff) {
                        fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",
                                uVar8 & 0xffffffff,&len);
                      }
                    }
                  }
                }
              }
              else {
                fprintf(_stderr,
                        "Could not execute the \"netconf\" subsystem!\n(Note that this can be a problem at the server! Please review the server logs.)\n"
                       );
              }
            }
          }
          else {
            fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
          }
        }
      }
      else {
        pcVar3 = inet_ntoa(fingerprint._4_4_);
        fprintf(__stream,"Failed to connect to %s!\n",pcVar3);
      }
    }
  }
LAB_00101a09:
  if (buf._1048568_8_ != 0) {
    libssh2_channel_free(buf._1048568_8_);
  }
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    char buf[1048576]; /* avoid any buffer reallocation for simplicity */
    ssize_t len;
    libssh2_socket_t sock;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address \"%s\"\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(830);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s!\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 4) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[4], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[4], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    /* open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Could not open the channel!\n"
                        "(Note that this can be a problem at the server!"
                       " Please review the server logs.)\n");
        goto shutdown;
    }

    /* execute the subsystem on our channel */
    if(libssh2_channel_subsystem(channel, "netconf")) {
        fprintf(stderr, "Could not execute the \"netconf\" subsystem!\n"
                        "(Note that this can be a problem at the server!"
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    /* NETCONF: https://tools.ietf.org/html/draft-ietf-netconf-ssh-06 */

    fprintf(stderr, "Sending NETCONF client <hello>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<hello>"
      "<capabilities>"
      "<capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability>"
      "</capabilities>"
      "</hello>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF server <hello>\n");
    len = netconf_read_until(channel, "</hello>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

    fprintf(stderr, "Sending NETCONF <rpc>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\">"
      "<get-interface-information><terse/></get-interface-information>"
      "</rpc>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF <rpc-reply>\n");
    len = netconf_read_until(channel, "</rpc-reply>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

shutdown:

    if(channel)
        libssh2_channel_free(channel);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    libssh2_exit();

    return 0;
}